

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::print(DataSet *this,uint n)

{
  ostream *poVar1;
  Shape *pSVar2;
  reference pvVar3;
  reference pvVar4;
  bool bVar5;
  uint local_1c;
  uint local_18;
  uint j;
  uint i;
  uint n_local;
  DataSet *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Dataset [");
  pSVar2 = Matrix::shape(&this->m_inputSet);
  poVar1 = operator<<(poVar1,pSVar2);
  poVar1 = std::operator<<(poVar1,"] - [");
  pSVar2 = Matrix::shape(&this->m_outputSet);
  poVar1 = operator<<(poVar1,pSVar2);
  poVar1 = std::operator<<(poVar1,"]: ");
  std::operator<<(poVar1,'\n');
  local_18 = 0;
  while( true ) {
    bVar5 = false;
    if (local_18 < n) {
      pSVar2 = Matrix::shape(&this->m_inputSet);
      bVar5 = local_18 < (pSVar2->field_0).m_dims[0];
    }
    if (!bVar5) break;
    for (local_1c = 0; local_1c < (this->m_inputSet).m_shape.field_0.m_dims[1];
        local_1c = local_1c + 1) {
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)this,(ulong)local_18);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(ulong)local_1c);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
      std::operator<<(poVar1,",\t\t");
    }
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&(this->m_outputSet).m_vals,(ulong)local_18);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
    std::operator<<(poVar1,'\n');
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void DataSet::print(uint n){
    std::cout<<"Dataset ["<<m_inputSet.shape()<<"] - ["<<m_outputSet.shape()<<"]: "<<'\n';
    for(uint i=0;i<n && i<m_inputSet.shape().n_row;++i){
        for(uint j=0;j<m_inputSet.m_shape.n_col;++j){
            std::cout<<m_inputSet.m_vals[i][j]<<",\t\t";
        }
        std::cout<<m_outputSet.m_vals[i][0]<<'\n';
    }
}